

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCBoolean.cpp
# Opt level: O0

void Assimp::IFC::ProcessBoolean(IfcBooleanResult *boolean,TempMesh *result,ConversionData *conv)

{
  bool bVar1;
  element_type *peVar2;
  IfcHalfSpaceSolid *hs_00;
  string local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  format local_3c8;
  IfcPolygonalBoundedHalfSpace *local_250;
  IfcPolygonalBoundedHalfSpace *hs_bounded;
  IfcSweptAreaSolid *local_240;
  IfcSweptAreaSolid *swept;
  IfcBooleanResult *op0;
  TempMesh first_operand;
  IfcExtrudedAreaSolid *as;
  IfcHalfSpaceSolid *hs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  format local_1a0;
  IfcBooleanResult *local_28;
  IfcBooleanResult *clip;
  ConversionData *conv_local;
  TempMesh *result_local;
  IfcBooleanResult *boolean_local;
  
  clip = (IfcBooleanResult *)conv;
  conv_local = (ConversionData *)result;
  result_local = (TempMesh *)boolean;
  local_28 = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcBooleanResult>
                       ((Object *)
                        ((long)&(boolean->super_IfcGeometricRepresentationItem).
                                super_IfcRepresentationItem.
                                super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                ._vptr_ObjectHelper +
                        (long)(boolean->super_IfcGeometricRepresentationItem).
                              super_IfcRepresentationItem.
                              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                              ._vptr_ObjectHelper[-3]));
  if (local_28 == (IfcBooleanResult *)0x0) {
    STEP::Object::GetClassName_abi_cxx11_
              (&local_408,
               (Object *)
               ((long)&(result_local->mVerts).
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start +
               (long)(result_local->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[-1].x));
    std::operator+(&local_3e8,"skipping unknown IfcBooleanResult entity, type is ",&local_408);
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
    basic_formatter<std::__cxx11::string>
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_3c8,
               &local_3e8);
    LogFunctions<Assimp::IFCImporter>::LogWarn(&local_3c8);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_3c8);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_408);
    return;
  }
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &(local_28->super_IfcGeometricRepresentationItem).field_0x30,"DIFFERENCE")
  ;
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)&local_1e0,
               (string *)&(local_28->super_IfcGeometricRepresentationItem).field_0x30);
    std::operator+(&local_1c0,"encountered unsupported boolean operator: ",&local_1e0);
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
    basic_formatter<std::__cxx11::string>
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_1a0,
               &local_1c0);
    LogFunctions<Assimp::IFCImporter>::LogWarn(&local_1a0);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_1a0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1e0);
    return;
  }
  peVar2 = std::
           __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_28->SecondOperand);
  hs_00 = STEP::EXPRESS::DataType::ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcHalfSpaceSolid>
                    (peVar2,*(DB **)&(clip->super_IfcGeometricRepresentationItem).
                                     super_IfcRepresentationItem.
                                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                     .field_0x18);
  peVar2 = std::
           __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_28->SecondOperand);
  first_operand.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)STEP::EXPRESS::DataType::
                ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcExtrudedAreaSolid>
                          (peVar2,*(DB **)&(clip->super_IfcGeometricRepresentationItem).
                                           super_IfcRepresentationItem.
                                           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                           .field_0x18);
  if ((hs_00 == (IfcHalfSpaceSolid *)0x0) &&
     ((IfcExtrudedAreaSolid *)
      first_operand.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage == (IfcExtrudedAreaSolid *)0x0)) {
    LogFunctions<Assimp::IFCImporter>::LogError
              ("expected IfcHalfSpaceSolid or IfcExtrudedAreaSolid as second clipping operand");
    return;
  }
  TempMesh::TempMesh((TempMesh *)&op0);
  peVar2 = std::
           __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_28->FirstOperand);
  swept = (IfcSweptAreaSolid *)
          STEP::EXPRESS::DataType::ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcBooleanResult>
                    (peVar2,*(DB **)&(clip->super_IfcGeometricRepresentationItem).
                                     super_IfcRepresentationItem.
                                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                     .field_0x18);
  if ((IfcBooleanResult *)swept == (IfcBooleanResult *)0x0) {
    peVar2 = std::
             __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_28->FirstOperand);
    local_240 = STEP::EXPRESS::DataType::
                ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcSweptAreaSolid>
                          (peVar2,*(DB **)&(clip->super_IfcGeometricRepresentationItem).
                                           super_IfcRepresentationItem.
                                           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                           .field_0x18);
    if (local_240 == (IfcSweptAreaSolid *)0x0) {
      LogFunctions<Assimp::IFCImporter>::LogError
                ("expected IfcSweptAreaSolid or IfcBooleanResult as first clipping operand");
      hs_bounded._4_4_ = 1;
      goto LAB_009b433a;
    }
    ProcessSweptAreaSolid(local_240,(TempMesh *)&op0,(ConversionData *)clip);
  }
  else {
    ProcessBoolean((IfcBooleanResult *)swept,(TempMesh *)&op0,(ConversionData *)clip);
  }
  if (hs_00 == (IfcHalfSpaceSolid *)0x0) {
    ProcessBooleanExtrudedAreaSolidDifference
              ((IfcExtrudedAreaSolid *)
               first_operand.mVertcnt.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,(TempMesh *)conv_local,(TempMesh *)&op0,
               (ConversionData *)clip);
  }
  else {
    peVar2 = std::
             __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_28->SecondOperand);
    local_250 = STEP::EXPRESS::DataType::
                ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcPolygonalBoundedHalfSpace>
                          (peVar2,*(DB **)&(clip->super_IfcGeometricRepresentationItem).
                                           super_IfcRepresentationItem.
                                           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                           .field_0x18);
    if (local_250 == (IfcPolygonalBoundedHalfSpace *)0x0) {
      ProcessBooleanHalfSpaceDifference
                (hs_00,(TempMesh *)conv_local,(TempMesh *)&op0,(ConversionData *)clip);
    }
    else {
      ProcessPolygonalBoundedBooleanHalfSpaceDifference
                (local_250,(TempMesh *)conv_local,(TempMesh *)&op0,(ConversionData *)clip);
    }
  }
  hs_bounded._4_4_ = 0;
LAB_009b433a:
  TempMesh::~TempMesh((TempMesh *)&op0);
  return;
}

Assistant:

void ProcessBoolean(const Schema_2x3::IfcBooleanResult& boolean, TempMesh& result, ConversionData& conv)
{
    // supported CSG operations:
    //   DIFFERENCE
    if(const Schema_2x3::IfcBooleanResult* const clip = boolean.ToPtr<Schema_2x3::IfcBooleanResult>()) {
        if(clip->Operator != "DIFFERENCE") {
            IFCImporter::LogWarn("encountered unsupported boolean operator: " + (std::string)clip->Operator);
            return;
        }

        // supported cases (1st operand):
        //  IfcBooleanResult -- call ProcessBoolean recursively
        //  IfcSweptAreaSolid -- obtain polygonal geometry first

        // supported cases (2nd operand):
        //  IfcHalfSpaceSolid -- easy, clip against plane
        //  IfcExtrudedAreaSolid -- reduce to an instance of the quadrify() algorithm


        const Schema_2x3::IfcHalfSpaceSolid* const hs = clip->SecondOperand->ResolveSelectPtr<Schema_2x3::IfcHalfSpaceSolid>(conv.db);
        const Schema_2x3::IfcExtrudedAreaSolid* const as = clip->SecondOperand->ResolveSelectPtr<Schema_2x3::IfcExtrudedAreaSolid>(conv.db);
        if(!hs && !as) {
            IFCImporter::LogError("expected IfcHalfSpaceSolid or IfcExtrudedAreaSolid as second clipping operand");
            return;
        }

        TempMesh first_operand;
        if(const Schema_2x3::IfcBooleanResult* const op0 = clip->FirstOperand->ResolveSelectPtr<Schema_2x3::IfcBooleanResult>(conv.db)) {
            ProcessBoolean(*op0,first_operand,conv);
        }
        else if (const Schema_2x3::IfcSweptAreaSolid* const swept = clip->FirstOperand->ResolveSelectPtr<Schema_2x3::IfcSweptAreaSolid>(conv.db)) {
            ProcessSweptAreaSolid(*swept,first_operand,conv);
        }
        else {
            IFCImporter::LogError("expected IfcSweptAreaSolid or IfcBooleanResult as first clipping operand");
            return;
        }

        if(hs) {

            const Schema_2x3::IfcPolygonalBoundedHalfSpace* const hs_bounded = clip->SecondOperand->ResolveSelectPtr<Schema_2x3::IfcPolygonalBoundedHalfSpace>(conv.db);
            if (hs_bounded) {
                ProcessPolygonalBoundedBooleanHalfSpaceDifference(hs_bounded, result, first_operand, conv);
            }
            else {
                ProcessBooleanHalfSpaceDifference(hs, result, first_operand, conv);
            }
        }
        else {
            ProcessBooleanExtrudedAreaSolidDifference(as, result, first_operand, conv);
        }
    }
    else {
        IFCImporter::LogWarn("skipping unknown IfcBooleanResult entity, type is " + boolean.GetClassName());
    }
}